

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O2

int gost_grasshopper_cipher_init_ctracpkm_omac(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  undefined1 *puVar2;
  EVP_MD_CTX *omac_ctx;
  uchar cipher_key [32];
  uchar auStack_48 [32];
  
  puVar2 = (undefined1 *)EVP_CIPHER_CTX_get_cipher_data();
  *puVar2 = 6;
  EVP_CIPHER_CTX_set_num(ctx);
  *(undefined4 *)(puVar2 + 0x1a8) = 0x1000;
  if (key == (uchar *)0x0) {
    iVar1 = gost_grasshopper_cipher_init(ctx,(uchar *)0x0,iv,enc);
    return iVar1;
  }
  omac_ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  *(EVP_MD_CTX **)(puVar2 + 0x1c8) = omac_ctx;
  if (omac_ctx == (EVP_MD_CTX *)0x0) {
    ERR_GOST_error(0xa2,0xc0100,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_grasshopper_cipher.c"
                   ,0x165);
  }
  else {
    iVar1 = gost2015_acpkm_omac_init(0x3f9,enc,key,omac_ctx,auStack_48,puVar2 + 0x1ac);
    if (iVar1 == 1) {
      iVar1 = gost_grasshopper_cipher_init(ctx,auStack_48,iv,enc);
      return iVar1;
    }
    EVP_MD_CTX_free(*(undefined8 *)(puVar2 + 0x1c8));
    *(undefined8 *)(puVar2 + 0x1c8) = 0;
  }
  return 0;
}

Assistant:

static GRASSHOPPER_INLINE int
gost_grasshopper_cipher_init_ctracpkm_omac(EVP_CIPHER_CTX
                                           *ctx, const unsigned
                                           char *key, const unsigned
                                           char *iv, int enc)
{
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);

    /* NB: setting type makes EVP do_cipher callback useless */
    c->c.type = GRASSHOPPER_CIPHER_CTRACPKMOMAC;
    EVP_CIPHER_CTX_set_num(ctx, 0);
    c->section_size = 4096;

    if (key) {
        unsigned char cipher_key[32];
        c->omac_ctx = EVP_MD_CTX_new();

        if (c->omac_ctx == NULL) {
            GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_INIT_CTRACPKM_OMAC, ERR_R_MALLOC_FAILURE);
            return 0;
        }

        if (gost2015_acpkm_omac_init(NID_kuznyechik_mac, enc, key,
           c->omac_ctx, cipher_key, c->kdf_seed) != 1) {
            EVP_MD_CTX_free(c->omac_ctx);
            c->omac_ctx = NULL;
            return 0;
        }

        return gost_grasshopper_cipher_init(ctx, cipher_key, iv, enc);
    }

    return gost_grasshopper_cipher_init(ctx, key, iv, enc);
}